

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

void lj_trace_freestate(global_State *g)

{
  size_t *psVar1;
  uint uVar2;
  void *pvVar3;
  anon_union_8_2_fd64ecd7_for_GCupval_5 aVar4;
  uint64_t uVar5;
  lua_CFunction p_Var6;
  size_t sVar7;
  
  lj_mcode_free((jit_State *)(g + 1));
  pvVar3 = *(void **)&g[1].uvhead.v;
  sVar7 = (ulong)(uint)g[1].vmstate * 4;
  (g->gc).total = (g->gc).total - (int)sVar7;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + sVar7;
  (*g->allocf)(g->allocd,pvVar3,sVar7,0);
  aVar4 = g[1].uvhead.field_5;
  uVar2._0_1_ = g[1].uvhead.marked;
  uVar2._1_1_ = g[1].uvhead.gct;
  uVar2._2_1_ = g[1].uvhead.closed;
  uVar2._3_1_ = g[1].uvhead.immutable;
  sVar7 = (ulong)uVar2 * 0xc;
  (g->gc).total = (g->gc).total - (int)sVar7;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + sVar7;
  (*g->allocf)(g->allocd,(void *)aVar4,sVar7,0);
  uVar2 = g[1].nilnode.freetop.ptr32;
  uVar5 = g[1].nilnode.key.u64;
  sVar7 = (ulong)(g[1].nilnode.next.ptr32 - uVar2) * 8;
  (g->gc).total = (g->gc).total - (int)sVar7;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + sVar7;
  (*g->allocf)(g->allocd,(void *)((ulong)uVar2 * 8 + uVar5),sVar7,0);
  p_Var6 = g[1].wrapf;
  sVar7 = (ulong)*(uint *)((long)&g[1].panic + 4) * 4;
  (g->gc).total = (g->gc).total - (int)sVar7;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + sVar7;
  (*g->allocf)(g->allocd,p_Var6,sVar7,0);
  return;
}

Assistant:

void lj_trace_freestate(global_State *g)
{
  jit_State *J = G2J(g);
#ifdef LUA_USE_ASSERT
  {  /* This assumes all traces have already been freed. */
    ptrdiff_t i;
    for (i = 1; i < (ptrdiff_t)J->sizetrace; i++)
      lj_assertG(i == (ptrdiff_t)J->cur.traceno || traceref(J, i) == NULL,
		 "trace still allocated");
  }
#endif
  lj_mcode_free(J);
  lj_mem_freevec(g, J->snapmapbuf, J->sizesnapmap, SnapEntry);
  lj_mem_freevec(g, J->snapbuf, J->sizesnap, SnapShot);
  lj_mem_freevec(g, J->irbuf + J->irbotlim, J->irtoplim - J->irbotlim, IRIns);
  lj_mem_freevec(g, J->trace, J->sizetrace, GCRef);
}